

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::ComputeHDivDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  int iVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  long lVar10;
  TPZVec<Fad<double>_> *vetor;
  TPZVec<Fad<double>_> *vetor_00;
  TPZVec<Fad<double>_> *vetor_01;
  TPZVec<Fad<double>_> *vetor_02;
  ulong uVar11;
  int i_1;
  long lVar12;
  Vector<double> *pVVar13;
  ulong uVar14;
  int i_2;
  int i;
  long lVar15;
  bool bVar16;
  Fad<double> Nv3v1;
  Fad<double> detjac;
  Fad<double> Nv3vdiag;
  TPZManVector<Fad<double>,_3> NormalScales;
  Fad<double> Nv2v3;
  Fad<double> Nv1v2;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  TPZManVector<Fad<double>,_3> v3;
  TPZManVector<Fad<double>,_3> v3vdiag;
  TPZManVector<Fad<double>,_3> vdiag;
  TPZManVector<Fad<double>,_3> v2v3;
  TPZManVector<Fad<double>,_3> v3v1;
  TPZManVector<Fad<double>,_3> v1v2;
  TPZManVector<Fad<double>,_3> vec3;
  TPZManVector<Fad<double>,_3> vec2;
  TPZManVector<Fad<double>,_3> vec1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_730;
  undefined1 local_720 [8];
  undefined8 local_718;
  double *pdStack_710;
  double dStack_708;
  undefined1 local_700 [16];
  double *local_6f0;
  Fad<double> local_6e8;
  Fad<double> local_6c8;
  Fad<double> local_6a8;
  TPZManVector<Fad<double>,_3> local_688;
  Fad<double> *local_608;
  Fad<double> *local_600;
  Fad<double> *local_5f8;
  Fad<double> local_5f0;
  Fad<double> local_5d0;
  TPZManVector<Fad<double>,_3> local_5b0;
  TPZManVector<Fad<double>,_3> local_530;
  TPZManVector<Fad<double>,_3> local_4b0;
  TPZManVector<Fad<double>,_3> local_430;
  TPZManVector<Fad<double>,_3> local_3b0;
  TPZManVector<Fad<double>,_3> local_330;
  TPZManVector<Fad<double>,_3> local_2b0;
  TPZManVector<Fad<double>,_3> local_230;
  TPZManVector<Fad<double>,_3> local_1b0;
  TPZManVector<Fad<double>,_3> local_130;
  TPZManVector<Fad<double>,_3> local_b0;
  
  TPZAxesTools<Fad<double>_>::ComputeDetjac(&local_6c8,gradx);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_530,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_5b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_4b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_230,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_2b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_330,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_130,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_1b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_3b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_430,3);
  lVar12 = 0;
  lVar15 = 0;
  do {
    pFVar5 = local_530.super_TPZVec<Fad<double>_>.fStore;
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar4 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar4->val_ + lVar12);
    pVVar13 = (Vector<double> *)
              ((long)&((local_530.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar12);
    pVVar13[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar13,(Vector<double> *)(puVar1 + 1));
    pFVar8 = local_5b0.super_TPZVec<Fad<double>_>.fStore;
    *(undefined8 *)((long)&pFVar5->defaultVal + lVar12) =
         *(undefined8 *)((long)&pFVar4->defaultVal + lVar12);
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar10 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar5 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar5[lVar10].val_ + lVar12);
    pVVar13 = (Vector<double> *)
              ((long)&((local_5b0.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar12);
    pVVar13[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar13,(Vector<double> *)(puVar1 + 1));
    pFVar4 = local_4b0.super_TPZVec<Fad<double>_>.fStore;
    *(undefined8 *)((long)&pFVar8->defaultVal + lVar12) =
         *(undefined8 *)((long)&pFVar5[lVar10].defaultVal + lVar12);
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar10 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar5 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar5[lVar10 * 2].val_ + lVar12);
    pVVar13 = (Vector<double> *)
              ((long)&((local_4b0.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar12);
    pVVar13[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar13,(Vector<double> *)(puVar1 + 1));
    *(undefined8 *)((long)&pFVar4->defaultVal + lVar12) =
         *(undefined8 *)((long)&pFVar5[lVar10 * 2].defaultVal + lVar12);
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_688.super_TPZVec<Fad<double>_>.fStore =
         (Fad<double> *)
         ((long)&gradx->fElem[(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow].val_
         + lVar12);
    local_688.super_TPZVec<Fad<double>_>._vptr_TPZVec =
         (_func_int **)((long)&gradx->fElem->val_ + lVar12);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(local_3b0.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar12),
               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_688);
    lVar15 = lVar15 + 1;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x60);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_530.super_TPZVec<Fad<double>_>,&local_5b0.super_TPZVec<Fad<double>_>,
             &local_230.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_5b0.super_TPZVec<Fad<double>_>,&local_4b0.super_TPZVec<Fad<double>_>,
             &local_330.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_4b0.super_TPZVec<Fad<double>_>,&local_530.super_TPZVec<Fad<double>_>,
             &local_2b0.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_4b0.super_TPZVec<Fad<double>_>,&local_3b0.super_TPZVec<Fad<double>_>,
             &local_430.super_TPZVec<Fad<double>_>);
  TPZNumeric::Norm<Fad<double>>(&local_5d0,(TPZNumeric *)&local_230,vetor);
  TPZNumeric::Norm<Fad<double>>(&local_5f0,(TPZNumeric *)&local_330,vetor_00);
  TPZNumeric::Norm<Fad<double>>(&local_6e8,(TPZNumeric *)&local_2b0,vetor_01);
  TPZNumeric::Norm<Fad<double>>(&local_6a8,(TPZNumeric *)&local_430,vetor_02);
  local_720 = (undefined1  [8])0x3ff0000000000000;
  local_718 = (Fad<double> *)((ulong)local_718._4_4_ << 0x20);
  pdStack_710 = (double *)0x0;
  dStack_708 = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_688,4,(Fad<double> *)local_720);
  Fad<double>::~Fad((Fad<double> *)local_720);
  local_5d0.val_ = 1.0;
  if (local_5d0.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_5d0.dx_,(double *)local_720);
  }
  local_5f0.val_ = 2.0;
  if (local_5f0.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_5f0.dx_,(double *)local_720);
  }
  local_6e8.val_ = 2.0;
  if (local_6e8.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_6e8.dx_,(double *)local_720);
  }
  local_6a8.val_ = 2.0;
  if (local_6a8.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_6a8.dx_,(double *)local_720);
  }
  local_5f8 = local_530.super_TPZVec<Fad<double>_>.fStore;
  local_600 = local_5b0.super_TPZVec<Fad<double>_>.fStore;
  local_608 = local_4b0.super_TPZVec<Fad<double>_>.fStore;
  lVar12 = 0;
  do {
    pdVar6 = local_6c8.dx_.ptr_to_data;
    iVar7 = local_6c8.dx_.num_elts;
    pFVar5 = local_5f8 + lVar12;
    lVar15 = (long)local_6c8.dx_.num_elts;
    uVar3 = local_5f8[lVar12].dx_.num_elts;
    uVar14 = (ulong)uVar3;
    if (lVar15 == 0) {
      if ((uVar14 != 0) && (0 < (int)uVar3)) {
        pdVar6 = (pFVar5->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar6[uVar11] = pdVar6[uVar11] / local_6c8.val_;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
    }
    else if (uVar14 == 0) {
      local_6f0 = (double *)local_6c8.val_;
      (pFVar5->dx_).num_elts = local_6c8.dx_.num_elts;
      uVar14 = lVar15 * 8;
      if (local_6c8.dx_.num_elts < 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pdVar9 = (double *)operator_new__(uVar14);
      (pFVar5->dx_).ptr_to_data = pdVar9;
      if (0 < iVar7) {
        dVar2 = pFVar5->val_;
        lVar10 = 0;
        do {
          pdVar9[lVar10] = (pdVar6[lVar10] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar6 = (pFVar5->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar6[uVar11] =
             (pdVar6[uVar11] * local_6c8.val_ - local_6c8.dx_.ptr_to_data[uVar11] * pFVar5->val_) /
             (local_6c8.val_ * local_6c8.val_);
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    pdVar6 = local_6c8.dx_.ptr_to_data;
    iVar7 = local_6c8.dx_.num_elts;
    pFVar5->val_ = pFVar5->val_ / local_6c8.val_;
    pFVar5 = local_600 + lVar12;
    lVar15 = (long)local_6c8.dx_.num_elts;
    uVar3 = local_600[lVar12].dx_.num_elts;
    uVar14 = (ulong)uVar3;
    if (lVar15 == 0) {
      if ((uVar14 != 0) && (0 < (int)uVar3)) {
        pdVar6 = (pFVar5->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar6[uVar11] = pdVar6[uVar11] / local_6c8.val_;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
    }
    else if (uVar14 == 0) {
      local_6f0 = (double *)local_6c8.val_;
      (pFVar5->dx_).num_elts = local_6c8.dx_.num_elts;
      uVar14 = lVar15 * 8;
      if (local_6c8.dx_.num_elts < 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pdVar9 = (double *)operator_new__(uVar14);
      (pFVar5->dx_).ptr_to_data = pdVar9;
      if (0 < iVar7) {
        dVar2 = pFVar5->val_;
        lVar10 = 0;
        do {
          pdVar9[lVar10] = (pdVar6[lVar10] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar6 = (pFVar5->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar6[uVar11] =
             (pdVar6[uVar11] * local_6c8.val_ - local_6c8.dx_.ptr_to_data[uVar11] * pFVar5->val_) /
             (local_6c8.val_ * local_6c8.val_);
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    pdVar6 = local_6c8.dx_.ptr_to_data;
    iVar7 = local_6c8.dx_.num_elts;
    pFVar5->val_ = pFVar5->val_ / local_6c8.val_;
    pFVar5 = local_608 + lVar12;
    lVar15 = (long)local_6c8.dx_.num_elts;
    uVar3 = local_608[lVar12].dx_.num_elts;
    uVar14 = (ulong)uVar3;
    if (lVar15 == 0) {
      if ((uVar14 != 0) && (0 < (int)uVar3)) {
        pdVar6 = (pFVar5->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar6[uVar11] = pdVar6[uVar11] / local_6c8.val_;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
    }
    else if (uVar14 == 0) {
      local_6f0 = (double *)local_6c8.val_;
      (pFVar5->dx_).num_elts = local_6c8.dx_.num_elts;
      uVar14 = lVar15 * 8;
      if (local_6c8.dx_.num_elts < 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pdVar9 = (double *)operator_new__(uVar14);
      (pFVar5->dx_).ptr_to_data = pdVar9;
      if (0 < iVar7) {
        dVar2 = pFVar5->val_;
        lVar10 = 0;
        do {
          pdVar9[lVar10] = (pdVar6[lVar10] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar6 = (pFVar5->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar6[uVar11] =
             (pdVar6[uVar11] * local_6c8.val_ - local_6c8.dx_.ptr_to_data[uVar11] * pFVar5->val_) /
             (local_6c8.val_ * local_6c8.val_);
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    pFVar5->val_ = pFVar5->val_ / local_6c8.val_;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  while( true ) {
    lVar15 = 0x22;
    do {
      local_700._0_8_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
      local_730.fadexpr_.left_ = (Fad<double> *)local_700;
      local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore;
      local_720 = (undefined1  [8])&local_730;
      local_718 = (Fad<double> *)0x4018000000000000;
      pdStack_710 = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar15 + -0x22)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (directions->fElem +
                 (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                 (lVar15 + -0x22) + lVar12,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)local_720);
      local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
      local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore;
      local_720 = (undefined1  [8])&local_730;
      local_718 = (Fad<double> *)0x4018000000000000;
      pdStack_710 = (double *)0x0;
      if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar15)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (directions->fElem +
                 (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * lVar15 +
                 lVar12,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                         *)local_720);
      bVar16 = lVar15 != 0x28;
      lVar15 = lVar15 + 1;
    } while (bVar16);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 7 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 8 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 9 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 10 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 7 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 8 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xb + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xc + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 9 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 10 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xe)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xd + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xf)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xe + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xf)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0xc + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0xe + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xf + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x11)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x10 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x12)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x11 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x13)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x12 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x14)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x13 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x11)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x12)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x10 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x11 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x15)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x14 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x16)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x15 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x13)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x14)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x12 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x13 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x17)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x16 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6a8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x18)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x17 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x16)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x18)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x15 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x17 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x19)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x18 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    local_730.fadexpr_.right_ = &local_5f0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1a)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x19 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1b)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1a + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1c)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1b + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1d)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1c + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1a)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1b)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x19 + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x1a + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1e)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1d + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1f)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1e + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1d)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x1b + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x1c + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x20)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x1f + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x21)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x20 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1f)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x21)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = directions->fElem + lVar15 * 0x1e + lVar12;
    lVar15 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = directions->fElem + lVar15 * 0x20 + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar15 <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x22)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x21 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2a)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x29 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2b)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2a + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2b + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    local_730.fadexpr_.right_ = &local_5d0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2d)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2c + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2e)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2d + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2f)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2e + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x30)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x2f + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x31)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x30 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x32)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x31 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x33)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x32 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x34)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x33 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    local_700._8_8_ = &local_5f0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x35)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x34 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x36)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x35 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x37)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x36 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x38)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x37 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_700._8_8_ = &local_6e8;
    local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x39)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x38 + lVar12,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3a)) break;
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x39 + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3b)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x3a + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x3b + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3d)) {
      local_730.fadexpr_.right_ = &local_5f0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5f0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x3c + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3e)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x3d + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    if (((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3f)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem +
               (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0x3e + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar12 = lVar12 + 1;
    if (lVar12 == 3) {
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_688);
      Fad<double>::~Fad(&local_6a8);
      Fad<double>::~Fad(&local_6e8);
      Fad<double>::~Fad(&local_5f0);
      Fad<double>::~Fad(&local_5d0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_430);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_3b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_1b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_130);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_330);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_2b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_230);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_4b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_5b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_530);
      Fad<double>::~Fad(&local_6c8);
      return;
    }
  }
  local_730.fadexpr_.right_ = &local_5d0;
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }